

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O3

void __thiscall dgrminer::PartialUnion::printAll(PartialUnion *this)

{
  pointer paVar1;
  pointer paVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  int i;
  long lVar6;
  pointer paVar7;
  pointer paVar8;
  ulong uVar9;
  array<int,_6UL> var;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"NODES (TIME, ID, LABEL, DELETED, CHANGETIME, CHANGETIMELINK):",
             0x3d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  paVar7 = (this->nodes).
           super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar1 = (this->nodes).
           super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (paVar7 != paVar1) {
    uVar9 = 0;
    bVar4 = false;
    do {
      local_48 = *(undefined8 *)(paVar7->_M_elems + 4);
      local_58 = *(undefined8 *)paVar7->_M_elems;
      uStack_50 = *(undefined8 *)(paVar7->_M_elems + 2);
      if ((uVar9 < 0x33) ||
         (((long)(this->nodes).
                 super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->nodes).
                 super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 0x14U <=
          uVar9)) {
        lVar6 = 0;
        do {
          poVar5 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&std::cout,*(int *)((long)&local_58 + lVar6 * 4));
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 6);
LAB_0015ce8b:
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
      }
      else {
        bVar3 = !bVar4;
        bVar4 = true;
        if (bVar3) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...",3);
          bVar4 = true;
          goto LAB_0015ce8b;
        }
      }
      uVar9 = uVar9 + 1;
      paVar7 = paVar7 + 1;
    } while (paVar7 != paVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "EDGES (TIME, SRC, DST, LABEL, DIRECTION, DELETED, CHANGETIME, ID):",0x42);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  paVar8 = (this->edges).
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar2 = (this->edges).
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (paVar8 != paVar2) {
    uVar9 = 0;
    bVar4 = false;
    do {
      local_48 = *(undefined8 *)(paVar8->_M_elems + 4);
      uStack_40 = *(undefined8 *)(paVar8->_M_elems + 6);
      local_58 = *(undefined8 *)paVar8->_M_elems;
      uStack_50 = *(undefined8 *)(paVar8->_M_elems + 2);
      if ((uVar9 < 0x33) ||
         (((long)(this->edges).
                 super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->edges).
                 super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 5) - 0x14U <= uVar9)) {
        lVar6 = 0;
        do {
          poVar5 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&std::cout,*(int *)((long)&local_58 + lVar6 * 4));
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 8);
LAB_0015cfcf:
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
        std::ostream::put(-0x58);
        std::ostream::flush();
      }
      else {
        bVar3 = !bVar4;
        bVar4 = true;
        if (bVar3) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...",3);
          bVar4 = true;
          goto LAB_0015cfcf;
        }
      }
      uVar9 = uVar9 + 1;
      paVar8 = paVar8 + 1;
    } while (paVar8 != paVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  printEncoding(this);
  return;
}

Assistant:

void PartialUnion::printAll() {
		using namespace std;

		int MAX_LIMIT = 50;

		int limit = 0;

		bool printed_dots = false;

		cout << "NODES (TIME, ID, LABEL, DELETED, CHANGETIME, CHANGETIMELINK):" << endl;
		for (array<int, 6> var : nodes)
		{
			if (limit > MAX_LIMIT && limit < nodes.size() - 20)
			{
				if (!printed_dots)
				{
					cout << "..." << endl;
					printed_dots = true;
				}
				limit++;
				continue;
			}
			for (int i = 0; i < 6; i++)
			{
				cout << var[i] << "\t";
			}
			cout << endl;

			limit++;

		}
		cout << endl;

		printed_dots = false;
		limit = 0;

		cout << "EDGES (TIME, SRC, DST, LABEL, DIRECTION, DELETED, CHANGETIME, ID):" << endl;
		for (array<int, 8> var : edges)
		{
			if (limit > MAX_LIMIT && limit < edges.size() - 20)
			{
				if (!printed_dots)
				{
					cout << "..." << endl;
					printed_dots = true;
				}
				limit++;
				continue;
			}
			for (int i = 0; i < 8; i++)
			{
				cout << var[i] << "\t";
			}
			cout << endl;

			limit++;
		}
		cout << endl;

		printEncoding();

	}